

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IO_Header.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::IO_Header::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,IO_Header *this)

{
  ostream *poVar1;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  IO_Header *local_18;
  IO_Header *this_local;
  
  local_18 = this;
  this_local = (IO_Header *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Originating Entity ID:\n");
  DATA_TYPE::EntityIdentifier::GetAsString_abi_cxx11_(&local_1f0,&this->m_OriginatingEntityID);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  std::operator<<(poVar1,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString IO_Header::GetAsString() const
{
    KStringStream ss;

    ss << "Originating Entity ID:\n"
       << IndentString( m_OriginatingEntityID.GetAsString(), 1 );

    return ss.str();
}